

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TonkineseMaps.h
# Opt level: O2

IConnection * __thiscall tonk::P2PConnectionKeyMap::FindByKey(P2PConnectionKeyMap *this,key_t key)

{
  atomic<int> *paVar1;
  uint uVar2;
  IConnection *pIVar3;
  Locker locker;
  Locker local_20;
  key_t local_14;
  
  local_20.TheLock = &this->P2PKeyLock;
  local_14 = key;
  std::recursive_mutex::lock(&(local_20.TheLock)->cs);
  uVar2 = LightHashMap<unsigned_int,_tonk::IConnection_*,_tonk::UInt32Hasher>::find_index
                    (&(this->P2PKeyMap).TheMap,&local_14);
  if (((int)uVar2 < 0) ||
     (pIVar3 = *(IConnection **)((this->P2PKeyMap).TheMap.m_values[uVar2].m_bits + 8),
     pIVar3 == (IConnection *)0x0)) {
    pIVar3 = (IConnection *)0x0;
  }
  else {
    LOCK();
    paVar1 = &(pIVar3->SelfRefCount).RefCount;
    (paVar1->super___atomic_base<int>)._M_i = (paVar1->super___atomic_base<int>)._M_i + 1;
    UNLOCK();
  }
  Locker::~Locker(&local_20);
  return pIVar3;
}

Assistant:

IConnection* FindByKey(key_t key)
    {
        Locker locker(P2PKeyLock);
        IConnection* connection = P2PKeyMap.Find(key);
        if (connection) {
            connection->SelfRefCount.IncrementReferences();
        }
        return connection;
    }